

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_83ee8::BuildContext::processHadError
          (BuildContext *this,ProcessContext *param_1,ProcessHandle param_2,Twine *message)

{
  string local_48;
  Twine *local_28;
  Twine *message_local;
  ProcessContext *param_1_local;
  BuildContext *this_local;
  ProcessHandle param_2_local;
  
  local_28 = message;
  message_local = (Twine *)param_1;
  param_1_local = (ProcessContext *)this;
  this_local = (BuildContext *)param_2.id;
  llvm::Twine::str_abi_cxx11_(&local_48,message);
  emitError(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void processHadError(ProcessContext*, ProcessHandle,
                       const Twine& message) override {
    emitError(message.str());
  }